

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Gia_Man_t *
Gia_ManDupWithArtificialBoxes
          (Gia_Man_t *p,int DelayC,int nPathMin,int nPathMax,int nPathLimit,int fUseFanout,
          int fXorTrick,int fIgnoreBoxDelays,int fVerbose)

{
  Gia_Man_t *pGVar1;
  
  Gia_ManIteratePaths(p,DelayC,nPathMin,nPathMax,nPathLimit,fIgnoreBoxDelays,fVerbose);
  pGVar1 = Gia_ManDupWithArtificalFaddBoxes(p,fUseFanout,fXorTrick);
  Gia_ManCleanMark01(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManDupWithArtificialBoxes( Gia_Man_t * p, int DelayC, int nPathMin, int nPathMax, int nPathLimit, int fUseFanout, int fXorTrick, int fIgnoreBoxDelays, int fVerbose )
{
    Gia_Man_t * pNew;
/*
    if ( Gia_ManBoxNum(p) > 0 )
    {
        printf( "Currently artifical carry-chains cannot be detected when natural ones are present.\n" );
        return NULL;
    }
*/
    Gia_ManIteratePaths( p, DelayC, nPathMin, nPathMax, nPathLimit, fIgnoreBoxDelays, fVerbose );
    pNew = Gia_ManDupWithArtificalFaddBoxes( p, fUseFanout, fXorTrick );
    Gia_ManCleanMark01( p );
    return pNew;
}